

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::PortDeclarationSyntax::PortDeclarationSyntax
          (PortDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,PortHeaderSyntax *header,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  bool bVar1;
  PortHeaderSyntax *pPVar2;
  DeclaratorSyntax *pDVar3;
  PortHeaderSyntax *in_RDX;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_RDI;
  size_t in_R8;
  pointer in_R9;
  DeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffffb0 [16];
  MemberSyntax *in_stack_ffffffffffffffc0;
  PortHeaderSyntax *local_38 [2];
  PortHeaderSyntax *local_28;
  size_t local_10;
  pointer local_8;
  
  local_28 = in_RDX;
  local_10 = in_R8;
  local_8 = in_R9;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0._12_4_,
             in_stack_ffffffffffffffb0._0_8_);
  local_38[0] = local_28;
  not_null<slang::syntax::PortHeaderSyntax_*>::not_null<slang::syntax::PortHeaderSyntax_*>
            ((not_null<slang::syntax::PortHeaderSyntax_*> *)
             &in_RDI[1].super_SyntaxListBase.super_SyntaxNode.previewNode,local_38);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
            (in_RDI,in_stack_ffffffffffffff88);
  in_RDI[2].super_SyntaxListBase.childCount = local_10;
  in_RDI[2].elements._M_ptr = local_8;
  pPVar2 = not_null<slang::syntax::PortHeaderSyntax_*>::operator->
                     ((not_null<slang::syntax::PortHeaderSyntax_*> *)0x75a731);
  (pPVar2->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
  in_RDI[1].elements._M_extent._M_extent_value = (size_t)in_RDI;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x75a754);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(in_RDI);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)in_RDI,
                       (iterator_base<slang::syntax::DeclaratorSyntax_*> *)in_stack_ffffffffffffff88
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x75a793);
    (pDVar3->super_SyntaxNode).parent = (SyntaxNode *)in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                *)in_RDI);
  }
  return;
}

Assistant:

PortDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, PortHeaderSyntax& header, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::PortDeclaration, attributes), header(&header), declarators(declarators), semi(semi) {
        this->header->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }